

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O2

void __thiscall AActorMover::Deactivate(AActorMover *this,AActor *activator)

{
  TObjPtr<AActor> *obj;
  uint uVar1;
  AActor *pAVar2;
  
  if ((this->super_APathFollower).super_AActor.field_0x499 == '\x01') {
    (this->super_APathFollower).super_AActor.field_0x499 = 0;
    obj = &(this->super_APathFollower).super_AActor.tracer;
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar2 != (AActor *)0x0) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      AActor::UnlinkFromWorld(pAVar2);
      uVar1 = (this->super_APathFollower).super_AActor.special1;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      (pAVar2->flags).Value = uVar1;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      AActor::LinkToWorld(pAVar2,false,(sector_t *)0x0);
      uVar1 = (this->super_APathFollower).super_AActor.special2;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      (pAVar2->flags2).Value = uVar1;
    }
  }
  return;
}

Assistant:

void AActorMover::Deactivate (AActor *activator)
{
	if (bActive)
	{
		Super::Deactivate (activator);
		if (tracer != NULL)
		{
			tracer->UnlinkFromWorld ();
			tracer->flags = ActorFlags::FromInt (special1);
			tracer->LinkToWorld ();
			tracer->flags2 = ActorFlags2::FromInt (special2);
		}
	}
}